

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connecion.cpp
# Opt level: O2

void __thiscall
Markov::Connection::Output
          (Connection *this,string *name,ostream *ostr,optional<unsigned_long_long> maxgenLocal)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  database *pdVar1;
  bool bVar2;
  anon_class_8_1_a8c68091 call_back;
  database_binder *binder;
  MarkovExceptionTemplate<Markov::Exception::ConfigNotFoundM> *this_00;
  uint __val;
  unsigned_long_long uVar3;
  uint i;
  undefined8 uVar4;
  ulong __n;
  str_ref sql;
  str_ref sql_00;
  str_ref sql_01;
  allocator<char> local_271;
  anon_class_24_3_dfed711c outGet;
  string stringRes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vec;
  database_binder dictStrPastm;
  database_binder pstm;
  MarkovDeque dq;
  string local_138;
  string pstmString;
  optional<Markov::ChainSettings> conf;
  
  GetConfig(&conf,this,name);
  if (conf.super__Optional_base<Markov::ChainSettings,_false,_false>._M_payload.
      super__Optional_payload<Markov::ChainSettings,_true,_false,_false>.
      super__Optional_payload_base<Markov::ChainSettings>._M_engaged == false) {
    this_00 = (MarkovExceptionTemplate<Markov::Exception::ConfigNotFoundM> *)
              __cxa_allocate_exception(0x10);
    MarkovExceptionTemplate<Markov::Exception::ConfigNotFoundM>::MarkovExceptionTemplate(this_00);
    __cxa_throw(this_00,&
                        _ZTIN6Markov23MarkovExceptionTemplateIXadsoKcL_ZNS_9Exception15ConfigNotFoundMEEEEEE
                ,std::logic_error::~logic_error);
  }
  uVar4 = maxgenLocal.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long_long>._M_payload;
  if (((undefined1  [16])
       maxgenLocal.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long_long> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    uVar4 = conf.super__Optional_base<Markov::ChainSettings,_false,_false>._M_payload.
            super__Optional_payload<Markov::ChainSettings,_true,_false,_false>.
            super__Optional_payload_base<Markov::ChainSettings>._M_payload._M_value.maxgen;
  }
  pstmString._M_dataplus._M_p = (pointer)&pstmString.field_2;
  pstmString._M_string_length = 0;
  pstmString.field_2._M_local_buf[0] = '\0';
  vec.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vec.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vec.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (__val = 1;
      __val <= conf.super__Optional_base<Markov::ChainSettings,_false,_false>._M_payload.
               super__Optional_payload<Markov::ChainSettings,_true,_false,_false>.
               super__Optional_payload_base<Markov::ChainSettings>._M_payload._M_value.N;
      __val = __val + 1) {
    std::__cxx11::to_string((string *)&dictStrPastm,__val);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pstm,"str",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &dictStrPastm);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dq,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pstm,"=?");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vec,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dq);
    std::__cxx11::string::~string((string *)&dq);
    std::__cxx11::string::~string((string *)&pstm);
    std::__cxx11::string::~string((string *)&dictStrPastm);
  }
  __rhs = &conf.super__Optional_base<Markov::ChainSettings,_false,_false>._M_payload.
           super__Optional_payload<Markov::ChainSettings,_true,_false,_false>.
           super__Optional_payload_base<Markov::ChainSettings>._M_payload._M_value.sqlite_table;
  std::operator+(&stringRes,"SELECT rstr FROM ",__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dictStrPastm,
                 &stringRes," WHERE ");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138," AND ",&local_271);
  anon_unknown.dwarf_2106a::joinStr((string *)&outGet,&vec,&local_138);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pstm,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dictStrPastm,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outGet);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dq,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pstm,
                 " ORDER BY RANDOM() LIMIT 1;");
  std::__cxx11::string::operator=((string *)&pstmString,(string *)&dq);
  std::__cxx11::string::~string((string *)&dq);
  std::__cxx11::string::~string((string *)&pstm);
  std::__cxx11::string::~string((string *)&outGet);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&dictStrPastm);
  std::__cxx11::string::~string((string *)&stringRes);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vec);
  sql._M_str = pstmString._M_dataplus._M_p;
  sql._M_len = pstmString._M_string_length;
  sqlite::database::operator<<
            (&pstm,(this->db).super___shared_ptr<sqlite::database,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,sql);
  pdVar1 = (this->db).super___shared_ptr<sqlite::database,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::operator+(&stringRes,"SELECT str FROM ",
                 &conf.super__Optional_base<Markov::ChainSettings,_false,_false>._M_payload.
                  super__Optional_payload<Markov::ChainSettings,_true,_false,_false>.
                  super__Optional_payload_base<Markov::ChainSettings>._M_payload._M_value.
                  sqlite_table_dict);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dq,&stringRes
                 ," WHERE rowid=? LIMIT 1;");
  sql_00._M_str =
       (char *)dq.super__Deque_base<long_long,_std::allocator<long_long>_>._M_impl.
               super__Deque_impl_data._M_map;
  sql_00._M_len =
       dq.super__Deque_base<long_long,_std::allocator<long_long>_>._M_impl.super__Deque_impl_data.
       _M_map_size;
  sqlite::database::operator<<(&dictStrPastm,pdVar1,sql_00);
  std::__cxx11::string::~string((string *)&dq);
  std::__cxx11::string::~string((string *)&stringRes);
  stringRes._M_dataplus._M_p = (pointer)0x0;
  std::deque<long_long,_std::allocator<long_long>_>::deque
            (&dq,(ulong)conf.super__Optional_base<Markov::ChainSettings,_false,_false>._M_payload.
                        super__Optional_payload<Markov::ChainSettings,_true,_false,_false>.
                        super__Optional_payload_base<Markov::ChainSettings>._M_payload._M_value.N,
             (value_type_conflict2 *)&stringRes,(allocator_type *)&outGet);
  if (conf.super__Optional_base<Markov::ChainSettings,_false,_false>._M_payload.
      super__Optional_payload<Markov::ChainSettings,_true,_false,_false>.
      super__Optional_payload_base<Markov::ChainSettings>._M_payload._M_value.rndstart == true) {
    pdVar1 = (this->db).super___shared_ptr<sqlite::database,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vec,
                   "SELECT * FROM ",__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outGet,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vec,
                   " ORDER BY RANDOM() LIMIT 1;");
    sql_01._M_str = (char *)outGet.conf;
    sql_01._M_len = (size_t)outGet.pstm;
    sqlite::database::operator<<((database_binder *)&stringRes,pdVar1,sql_01);
    std::__cxx11::string::~string((string *)&outGet);
    std::__cxx11::string::~string((string *)&vec);
    sqlite::detail::operator>>((database_binder *)&stringRes,(anon_class_8_1_a8c68091)&outGet);
    for (__n = 0; __n < conf.super__Optional_base<Markov::ChainSettings,_false,_false>._M_payload.
                        super__Optional_payload<Markov::ChainSettings,_true,_false,_false>.
                        super__Optional_payload_base<Markov::ChainSettings>._M_payload._M_value.N;
        __n = __n + 1) {
      call_back.value =
           std::_Deque_iterator<long_long,_long_long_&,_long_long_*>::operator[]
                     (&dq.super__Deque_base<long_long,_std::allocator<long_long>_>._M_impl.
                       super__Deque_impl_data._M_start,__n);
      sqlite::detail::operator>>((database_binder *)&stringRes,call_back);
    }
    sqlite::database_binder::~database_binder((database_binder *)&stringRes);
  }
  outGet.conf = &conf;
  stringRes._M_dataplus._M_p = (pointer)&stringRes.field_2;
  stringRes._M_string_length = 0;
  stringRes.field_2._M_local_buf[0] = '\0';
  outGet.pstm = &pstm;
  outGet.dq = &dq;
  vec.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)Output::anon_class_24_3_dfed711c::operator()(&outGet);
  uVar3 = 0;
  while (vec.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    binder = sqlite::operator<<(&dictStrPastm,(longlong *)&vec);
    sqlite::detail::operator>>(binder,&stringRes);
    std::operator<<(ostr,(string *)&stringRes);
    bVar2 = std::operator!=(&stringRes,"\n");
    if (bVar2) {
      std::operator<<(ostr,(string *)
                           &conf.super__Optional_base<Markov::ChainSettings,_false,_false>.
                            _M_payload.
                            super__Optional_payload<Markov::ChainSettings,_true,_false,_false>.
                            super__Optional_payload_base<Markov::ChainSettings>._M_payload._M_value.
                            prefixmiddle);
    }
    if ((uVar4 != 0) && (uVar3 = uVar3 + 1, uVar3 == uVar4)) break;
    anon_unknown.dwarf_2106a::shiftDeque<long_long>(&dq,(longlong *)&vec);
    vec.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)Output::anon_class_24_3_dfed711c::operator()(&outGet);
  }
  std::__cxx11::string::~string((string *)&stringRes);
  std::_Deque_base<long_long,_std::allocator<long_long>_>::~_Deque_base
            (&dq.super__Deque_base<long_long,_std::allocator<long_long>_>);
  sqlite::database_binder::~database_binder(&dictStrPastm);
  sqlite::database_binder::~database_binder(&pstm);
  std::__cxx11::string::~string((string *)&pstmString);
  std::_Optional_payload_base<Markov::ChainSettings>::_M_reset
            ((_Optional_payload_base<Markov::ChainSettings> *)&conf);
  return;
}

Assistant:

void Connection::Output(const std::string& name, std::ostream& ostr, std::optional<unsigned long long int> maxgenLocal) {
		auto conf = GetConfig(name);

		if (!conf) throw Exception::ConfigNotFound();
		unsigned long long int maxgen = (maxgenLocal ? (*maxgenLocal) : conf->maxgen);

		std::string pstmString;
			{
			std::vector<std::string> vec;

			for (int i = 1; i <= conf->N; ++i) {
					vec.push_back("str" + std::to_string(i) + "=?"); // All "base" strings
					}

			pstmString = "SELECT rstr FROM " + conf->sqlite_table + " WHERE " + joinStr(vec, " AND ") + " ORDER BY RANDOM() LIMIT 1;";
			}

		auto pstm = *db << pstmString;
		auto dictStrPastm = *db << "SELECT str FROM " + conf->sqlite_table_dict + " WHERE rowid=? LIMIT 1;";

		MarkovDeque dq(conf->N, 0);

		if (conf->rndstart) {
				auto row = *db << "SELECT * FROM " + conf->sqlite_table + " ORDER BY RANDOM() LIMIT 1;";
				rowid_t id;
				row >> id;

				for (unsigned int i = 0; i < conf->N; ++i) row >> dq[i];
				}

		auto outGet = [&conf, &pstm, &dq]() {
			for (size_t i = 0; i < conf->N; ++i) {
					pstm << dq.at(i);
					}

			rowid_t res = 0;
			pstm >> res;
			return res;
			};

		unsigned long long int n = 0;
		std::string stringRes;

		for (rowid_t res = outGet(); res != 0; res = outGet()) {
				dictStrPastm << res >> stringRes;
				ostr << stringRes;

				if (stringRes != "\n") ostr << conf->prefixmiddle;

				if (maxgen > 0 && ++n == maxgen) {
						return;
						}

				shiftDeque(dq, res);
				}
		}